

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

u8 * pageFindSlot(MemPage *pPg,int nByte,int *pRc)

{
  u32 uVar1;
  u8 *puVar2;
  ulong uVar3;
  undefined8 uVar4;
  ulong uVar5;
  ushort uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  
  uVar3 = (ulong)pPg->hdrOffset;
  puVar2 = pPg->aData;
  uVar5 = uVar3 + 1;
  uVar1 = pPg->pBt->usableSize;
  uVar7 = (uint)(ushort)(*(ushort *)(puVar2 + uVar3 + 1) << 8 | *(ushort *)(puVar2 + uVar3 + 1) >> 8
                        );
  do {
    uVar8 = uVar7;
    if ((int)(uVar1 - 4) < (int)uVar7) break;
    uVar6 = *(ushort *)(puVar2 + (ulong)uVar7 + 2) << 8 |
            *(ushort *)(puVar2 + (ulong)uVar7 + 2) >> 8;
    uVar8 = (uint)uVar6 - nByte;
    if (-1 < (int)uVar8) {
      if ((int)(uVar6 + uVar7) <= (int)uVar1) {
        if (uVar8 < 4) {
          if (0x39 < puVar2[uVar3 + 7]) {
            return (u8 *)0x0;
          }
          *(undefined2 *)(puVar2 + uVar5) = *(undefined2 *)(puVar2 + uVar7);
          puVar2[uVar3 + 7] = puVar2[uVar3 + 7] + (char)uVar8;
        }
        else {
          *(ushort *)(puVar2 + (ulong)uVar7 + 2) = (ushort)uVar8 << 8 | (ushort)uVar8 >> 8;
        }
        return puVar2 + (uVar8 + uVar7);
      }
      uVar4 = 0xfbdc;
      goto LAB_0013991e;
    }
    uVar8 = (uint)(ushort)(*(ushort *)(puVar2 + uVar7) << 8 | *(ushort *)(puVar2 + uVar7) >> 8);
    uVar9 = uVar6 + uVar7;
    uVar5 = (ulong)uVar7;
    uVar7 = uVar8;
  } while (uVar9 <= uVar8);
  if (uVar8 != 0) {
    uVar4 = 0xfbf3;
LAB_0013991e:
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar4,
                "bf8c1b2b7a5960c282e543b9c293686dccff272512d08865f4600fb58238b4f9");
    *pRc = 0xb;
  }
  return (u8 *)0x0;
}

Assistant:

static u8 *pageFindSlot(MemPage *pPg, int nByte, int *pRc){
  const int hdr = pPg->hdrOffset;
  u8 * const aData = pPg->aData;
  int iAddr = hdr + 1;
  int pc = get2byte(&aData[iAddr]);
  int x;
  int usableSize = pPg->pBt->usableSize;
  int size;            /* Size of the free slot */

  assert( pc>0 );
  while( pc<=usableSize-4 ){
    /* EVIDENCE-OF: R-22710-53328 The third and fourth bytes of each
    ** freeblock form a big-endian integer which is the size of the freeblock
    ** in bytes, including the 4-byte header. */
    size = get2byte(&aData[pc+2]);
    if( (x = size - nByte)>=0 ){
      testcase( x==4 );
      testcase( x==3 );
      if( size+pc > usableSize ){
        *pRc = SQLITE_CORRUPT_PAGE(pPg);
        return 0;
      }else if( x<4 ){
        /* EVIDENCE-OF: R-11498-58022 In a well-formed b-tree page, the total
        ** number of bytes in fragments may not exceed 60. */
        if( aData[hdr+7]>57 ) return 0;

        /* Remove the slot from the free-list. Update the number of
        ** fragmented bytes within the page. */
        memcpy(&aData[iAddr], &aData[pc], 2);
        aData[hdr+7] += (u8)x;
      }else{
        /* The slot remains on the free-list. Reduce its size to account
         ** for the portion used by the new allocation. */
        put2byte(&aData[pc+2], x);
      }
      return &aData[pc + x];
    }
    iAddr = pc;
    pc = get2byte(&aData[pc]);
    if( pc<iAddr+size ) break;
  }
  if( pc ){
    *pRc = SQLITE_CORRUPT_PAGE(pPg);
  }

  return 0;
}